

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall
ft::deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
          (deque<int,ft::allocator<int>> *this,constDequeIterator<int,_64UL> *first,
          constDequeIterator<int,_64UL> *last,type *param_3)

{
  difference_type dVar1;
  type *in_R8;
  constDequeIterator<int,_64UL> local_170;
  constDequeIterator<int,_64UL> local_148;
  constDequeIterator<int,_64UL> local_120;
  constDequeIterator<int,_64UL> local_f8;
  constDequeIterator<int,_64UL> local_d0;
  constDequeIterator<int,_64UL> local_a8;
  constDequeIterator<int,_64UL> local_80;
  undefined1 local_58 [8];
  constDequeIterator<int,_64UL> middle;
  
  deque<int,_ft::allocator<int>_>::clear((deque<int,_ft::allocator<int>_> *)this);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_a8,first);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_170,first);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_148,last);
  dVar1 = distance<ft::constDequeIterator<int,64ul>>(&local_170,&local_148,(type *)0x0);
  next<ft::constDequeIterator<int,64ul>>
            ((constDequeIterator<int,_64UL> *)local_58,(ft *)&local_a8,
             (constDequeIterator<int,_64UL> *)(dVar1 / 2),0,in_R8);
  while (middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator !=
         (_func_int **)(last->super_dequeIterator<int,_64UL>).m_cur) {
    deque<int,_ft::allocator<int>_>::push_back
              ((deque<int,_ft::allocator<int>_> *)this,
               (value_type_conflict *)middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator);
    middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator =
         (_func_int **)((long)middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator + 4);
    if (middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator ==
        (_func_int **)middle.super_dequeIterator<int,_64UL>.m_first) {
      middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator =
           *(_func_int ***)(middle.super_dequeIterator<int,_64UL>.m_last + 2);
      middle.super_dequeIterator<int,_64UL>.m_first =
           (pointer)(middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator + 0x20);
      middle.super_dequeIterator<int,_64UL>.m_cur =
           (pointer)middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator;
      middle.super_dequeIterator<int,_64UL>.m_last =
           middle.super_dequeIterator<int,_64UL>.m_last + 2;
    }
  }
  constDequeIterator<int,_64UL>::constDequeIterator(&local_80,first);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_f8,first);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_d0,last);
  dVar1 = distance<ft::constDequeIterator<int,64ul>>(&local_f8,&local_d0,(type *)0x0);
  next<ft::constDequeIterator<int,64ul>>
            (&local_120,(ft *)&local_80,(constDequeIterator<int,_64UL> *)(dVar1 / 2),0,in_R8);
  middle.super_dequeIterator<int,_64UL>.m_cur = local_120.super_dequeIterator<int,_64UL>.m_first;
  middle.super_dequeIterator<int,_64UL>.m_first = local_120.super_dequeIterator<int,_64UL>.m_last;
  middle.super_dequeIterator<int,_64UL>.m_last =
       (pointer)local_120.super_dequeIterator<int,_64UL>.m_node;
  while (local_120.super_dequeIterator<int,_64UL>.m_cur !=
         (first->super_dequeIterator<int,_64UL>).m_cur) {
    if (local_120.super_dequeIterator<int,_64UL>.m_cur ==
        middle.super_dequeIterator<int,_64UL>.m_cur) {
      middle.super_dequeIterator<int,_64UL>.m_cur =
           *(pointer *)(middle.super_dequeIterator<int,_64UL>.m_last + -2);
      local_120.super_dequeIterator<int,_64UL>.m_cur =
           middle.super_dequeIterator<int,_64UL>.m_cur + 0x40;
      middle.super_dequeIterator<int,_64UL>.m_first = local_120.super_dequeIterator<int,_64UL>.m_cur
      ;
      middle.super_dequeIterator<int,_64UL>.m_last =
           middle.super_dequeIterator<int,_64UL>.m_last + -2;
    }
    middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator =
         (_func_int **)((long)local_120.super_dequeIterator<int,_64UL>.m_cur + -4);
    deque<int,_ft::allocator<int>_>::push_front
              ((deque<int,_ft::allocator<int>_> *)this,
               (value_type_conflict *)middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator);
    local_120.super_dequeIterator<int,_64UL>.m_cur =
         (pointer)middle.super_dequeIterator<int,_64UL>._vptr_dequeIterator;
  }
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();

		Iterator	middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != last) {
			this->push_back(*middle);
			++middle;
		}

		middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != first) {
			--middle;
			this->push_front(*middle);
		}
	}